

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

Position * __thiscall
pfederc::Position::operator+(Position *__return_storage_ptr__,Position *this,Position *pos)

{
  size_t line;
  size_t startIndex;
  unsigned_long *puVar1;
  Position *pos_local;
  Position *this_local;
  
  puVar1 = std::min<unsigned_long>(&this->line,&pos->line);
  line = *puVar1;
  puVar1 = std::min<unsigned_long>(&this->startIndex,&pos->startIndex);
  startIndex = *puVar1;
  puVar1 = std::max<unsigned_long>(&this->endIndex,&pos->endIndex);
  Position(__return_storage_ptr__,line,startIndex,*puVar1);
  return __return_storage_ptr__;
}

Assistant:

Position Position::operator +(const Position &pos) const noexcept {
  return Position{std::min(line, pos.line),
    std::min(startIndex, pos.startIndex),
    std::max(endIndex, pos.endIndex)};
}